

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

bool __thiscall
Diligent::ShaderVariableIndexLocator::
TryResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
          (ShaderVariableIndexLocator *this,Uint32 NextResourceTypeOffset,Uint32 VarCount)

{
  ulong uVar1;
  uint uVar2;
  char (*in_R8) [2];
  bool bVar3;
  string msg;
  char local_38 [8];
  
  uVar1 = this->VarOffset;
  if (uVar1 < NextResourceTypeOffset) {
    uVar2 = (uint)((uVar1 & 0xffffffff) / 0x18);
    if ((int)((uVar1 & 0xffffffff) % 0x18) != 0) {
      local_38[0] = '\x18';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      FormatString<char[42],unsigned_long,char[2]>
                (&msg,(Diligent *)"Offset is not multiple of resource type (",
                 (char (*) [42])local_38,(unsigned_long *)0x2caa26,in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"TryResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x225);
      std::__cxx11::string::~string((string *)&msg);
    }
    bVar3 = VarCount <= uVar2;
    VarCount = uVar2;
    if (bVar3) {
      FormatString<char[131]>
                (&msg,(char (*) [131])
                      "Relative offset is out of bounds which either means the variable does not belong to this SRB or there is a bug in variable offsets"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"TryResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x229);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  this->Index = this->Index + VarCount;
  return uVar1 < NextResourceTypeOffset;
}

Assistant:

bool TryResource(Uint32 NextResourceTypeOffset, Uint32 VarCount)
    {
        if (VarOffset < NextResourceTypeOffset)
        {
            auto RelativeOffset = VarOffset - Mgr.GetResourceOffset<ResourceType>();
            DEV_CHECK_ERR(RelativeOffset % sizeof(ResourceType) == 0, "Offset is not multiple of resource type (", sizeof(ResourceType), ")");
            RelativeOffset /= sizeof(ResourceType);
            VERIFY(RelativeOffset >= 0 && RelativeOffset < VarCount,
                   "Relative offset is out of bounds which either means the variable does not belong to this SRB or "
                   "there is a bug in variable offsets");
            Index += static_cast<Uint32>(RelativeOffset);
            return true;
        }
        else
        {
            Index += VarCount;
            return false;
        }
    }